

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O1

PSH_Globals_Funcs cff_size_get_globals_funcs(CFF_Size size)

{
  FT_Face pFVar1;
  undefined8 *puVar2;
  code *UNRECOVERED_JUMPTABLE;
  FT_Module pFVar3;
  PSH_Globals_Funcs pPVar4;
  
  pFVar1 = (size->root).face;
  puVar2 = *(undefined8 **)(pFVar1[4].bbox.yMin + 0x1358);
  pFVar3 = FT_Get_Module((pFVar1->driver->root).library,"pshinter");
  if (((pFVar3 != (FT_Module)0x0) && (puVar2 != (undefined8 *)0x0)) &&
     (UNRECOVERED_JUMPTABLE = (code *)*puVar2, UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    pPVar4 = (PSH_Globals_Funcs)(*UNRECOVERED_JUMPTABLE)(pFVar3);
    return pPVar4;
  }
  return (PSH_Globals_Funcs)0x0;
}

Assistant:

static PSH_Globals_Funcs
  cff_size_get_globals_funcs( CFF_Size  size )
  {
    CFF_Face          face     = (CFF_Face)size->root.face;
    CFF_Font          font     = (CFF_Font)face->extra.data;
    PSHinter_Service  pshinter = font->pshinter;
    FT_Module         module;


    module = FT_Get_Module( size->root.face->driver->root.library,
                            "pshinter" );
    return ( module && pshinter && pshinter->get_globals_funcs )
           ? pshinter->get_globals_funcs( module )
           : 0;
  }